

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O2

string * __thiscall
chatra::toString_abi_cxx11_
          (string *__return_storage_ptr__,chatra *this,StringTable *sTable,ArgumentSpec *arg)

{
  __buckets_ptr pp_Var1;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (sTable->baseVersion != Invalid) {
    StringTable::ref_abi_cxx11_(&local_40,(StringTable *)this,sTable->baseVersion);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pp_Var1 = (sTable->strToId)._M_h._M_buckets;
  if (pp_Var1 != (__buckets_ptr)0x0) {
    StringTable::ref_abi_cxx11_(&local_60,(StringTable *)this,*(StringId *)(pp_Var1 + 2));
    std::operator+(&local_40,":",&local_60);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const StringTable* sTable, const ArgumentSpec& arg) {
	std::string ret;
	if (arg.key != StringId::Invalid)
		ret += sTable->ref(arg.key);
	if (arg.cl != nullptr)
		ret += ":" + sTable->ref(arg.cl->getName());
	return ret;
}